

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::updateBtranPSE(HEkkPrimal *this,HVector *col_steepest_edge)

{
  HighsSimplexAnalysis *pHVar1;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x44,0);
  pHVar1 = this->analysis;
  if (pHVar1->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore
              (pHVar1,9,col_steepest_edge,(this->ekk_instance_->info_).col_steepest_edge_density);
    pHVar1 = this->analysis;
  }
  HSimplexNla::btran(&this->ekk_instance_->simplex_nla_,col_steepest_edge,
                     (this->ekk_instance_->info_).col_steepest_edge_density,
                     pHVar1->pointer_serial_factor_clocks);
  pHVar1 = this->analysis;
  if (pHVar1->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(pHVar1,9,col_steepest_edge);
    pHVar1 = this->analysis;
  }
  HighsSimplexAnalysis::simplexTimerStop(pHVar1,0x44,0);
  HEkk::updateOperationResultDensity
            (this->ekk_instance_,(double)col_steepest_edge->count / (double)this->num_row,
             &(this->ekk_instance_->info_).col_steepest_edge_density);
  return;
}

Assistant:

void HEkkPrimal::updateBtranPSE(HVector& col_steepest_edge) {
  analysis->simplexTimerStart(BtranPseClock);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(
        kSimplexNlaBtranPse, col_steepest_edge,
        ekk_instance_.info_.col_steepest_edge_density);
  // Perform BTRAN PSE
  ekk_instance_.simplex_nla_.btran(
      col_steepest_edge, ekk_instance_.info_.col_steepest_edge_density,
      analysis->pointer_serial_factor_clocks);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaBtranPse, col_steepest_edge);
  analysis->simplexTimerStop(BtranPseClock);
  const double local_col_steepest_edge_density =
      (1.0 * col_steepest_edge.count) / num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_steepest_edge_density,
      ekk_instance_.info_.col_steepest_edge_density);
}